

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O1

int ReadVector(FILE *fp,int n,int_t *where,int perline,int persize)

{
  long lVar1;
  char cVar2;
  int in_EAX;
  int iVar3;
  char *pcVar4;
  char *__s;
  int iVar5;
  long lVar6;
  long lVar7;
  char buf [100];
  char local_98 [104];
  
  if (0 < n) {
    iVar5 = 0;
    do {
      __s = local_98;
      pcVar4 = fgets(__s,100,(FILE *)fp);
      in_EAX = (int)pcVar4;
      if (0 < perline) {
        lVar6 = 0;
        do {
          lVar1 = lVar6 + 1;
          cVar2 = __s[persize];
          __s[persize] = '\0';
          iVar3 = atoi(__s);
          __s[persize] = cVar2;
          in_EAX = iVar3 + -1;
          where[iVar5 + lVar6] = in_EAX;
          if (perline <= lVar1) break;
          __s = __s + persize;
          lVar7 = lVar6 + (long)iVar5 + 1;
          lVar6 = lVar1;
        } while (lVar7 < (long)(ulong)(uint)n);
        iVar5 = iVar5 + (int)lVar1;
      }
    } while (iVar5 < n);
  }
  return in_EAX;
}

Assistant:

static int ReadVector(FILE *fp, int n, int_t *where, int perline, int persize)
{
    int_t i, j, item;
    char tmp, buf[100];

    i = 0;
    while (i < n) {
        fgets(buf, 100, fp);    /* read a line at a time */
        for (j=0; j<perline && i<n; j++) {
            tmp = buf[(j+1)*persize];     /* save the char at that place */
            buf[(j+1)*persize] = 0;       /* null terminate */
            item = atoi(&buf[j*persize]); 
            buf[(j+1)*persize] = tmp;     /* recover the char at that place */
            where[i++] = item - 1;
        }
    }

    return 0;
}